

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash_table.c
# Opt level: O0

uint32 key2hash(hash_table_t *h,char *key)

{
  int iVar1;
  byte bVar2;
  uint local_2c;
  int local_28;
  uint32 hash;
  int32 s;
  uchar c;
  char *cp;
  char *key_local;
  hash_table_t *h_local;
  
  local_2c = 0;
  local_28 = 0;
  _s = (byte *)key;
  if (h->nocase == 0) {
    for (; *_s != '\0'; _s = (byte *)((char *)_s + 1)) {
      local_2c = ((int)(char)*_s << ((byte)local_28 & 0x1f)) + local_2c;
      iVar1 = local_28 + 5;
      if (0x18 < local_28 + 5) {
        iVar1 = local_28 + -0x13;
      }
      local_28 = iVar1;
    }
  }
  else {
    for (; *_s != 0; _s = _s + 1) {
      bVar2 = *_s;
      if ((0x60 < bVar2) && (bVar2 < 0x7b)) {
        bVar2 = bVar2 - 0x20;
      }
      local_2c = ((uint)bVar2 << ((byte)local_28 & 0x1f)) + local_2c;
      iVar1 = local_28 + 5;
      if (0x18 < local_28 + 5) {
        iVar1 = local_28 + -0x13;
      }
      local_28 = iVar1;
    }
  }
  return local_2c % (uint)h->size;
}

Assistant:

static uint32
key2hash(hash_table_t * h, const char *key)
{

    register const char *cp;

    /* This is a hack because the best way to solve it is to make sure 
       all character representation is unsigned character in the first place.        
       (or better unicode.) */
    register unsigned char c;
    register int32 s;
    register uint32 hash;

    hash = 0;
    s = 0;

    if (h->nocase) {
        for (cp = key; *cp; cp++) {
            c = *cp;
            c = UPPER_CASE(c);
            hash += c << s;
            s += 5;
            if (s >= 25)
                s -= 24;
        }
    }
    else {
        for (cp = key; *cp; cp++) {
            hash += (*cp) << s;
            s += 5;
            if (s >= 25)
                s -= 24;
        }
    }

    return (hash % h->size);
}